

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall EventLoop::wakeup(EventLoop *this)

{
  LogStream *pLVar1;
  Logger local_ff8;
  ssize_t local_20;
  ssize_t n;
  uint64_t one;
  EventLoop *this_local;
  
  n = 1;
  one = (uint64_t)this;
  local_20 = write(this->wakeupFd_,&n,8);
  if (local_20 != 8) {
    Logger::Logger(&local_ff8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EventLoop.cpp"
                   ,0x6e);
    pLVar1 = Logger::stream(&local_ff8);
    pLVar1 = LogStream::operator<<(pLVar1,"Error: EventLoop::wakeup() writes ");
    pLVar1 = LogStream::operator<<(pLVar1,local_20);
    LogStream::operator<<(pLVar1," bytes instead of 8");
    Logger::~Logger(&local_ff8);
  }
  return;
}

Assistant:

void EventLoop::wakeup() {
    uint64_t one = 1;
    ssize_t n = write(wakeupFd_, &one, sizeof one);
    if (n != sizeof one) {
        LOG << "Error: EventLoop::wakeup() writes " << n << " bytes instead of 8";
    }
}